

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

HelicsBool helicsDataBufferConvertToType(HelicsDataBuffer data,int newDataType)

{
  DataType DVar1;
  Message *pMVar2;
  SmallBuffer *ptr;
  defV oVal;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_b0;
  undefined1 local_88;
  undefined1 local_80 [16];
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_68;
  byte *local_30;
  bool local_28;
  bool local_26;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar2 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar2 == (Message *)0x0) {
      return 0;
    }
    data = &pMVar2->data;
  }
  DVar1 = helics::detail::detectType(((SmallBuffer *)data)->heap);
  if (DVar1 != newDataType) {
    local_b0._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
    local_88 = 0;
    local_80._0_8_ = ((SmallBuffer *)data)->bufferSize;
    local_80._8_8_ = ((SmallBuffer *)data)->heap;
    local_70 = (element_type *)0x0;
    _Stack_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::valueExtract((data_view *)local_80,HELICS_ANY,(defV *)&local_b0._M_first);
    if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_68._M_pi);
    }
    helics::typeConvertDefV((SmallBuffer *)local_80,newDataType,(defV *)&local_b0._M_first);
    helics::SmallBuffer::operator=((SmallBuffer *)data,(SmallBuffer *)local_80);
    if (((local_26 == true) && (local_28 == false)) && (local_30 != (byte *)0x0)) {
      operator_delete__(local_30);
    }
    std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)&local_b0._M_first);
  }
  return 1;
}

Assistant:

HelicsBool helicsDataBufferConvertToType(HelicsDataBuffer data, int newDataType)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return HELICS_FALSE;
    }
    auto type = helics::detail::detectType(ptr->data());
    if (static_cast<int>(type) == newDataType) {
        return HELICS_TRUE;
    }
    helics::defV oVal;
    helics::valueExtract(*ptr, helics::DataType::HELICS_ANY, oVal);
    *ptr = helics::typeConvertDefV(static_cast<helics::DataType>(newDataType), oVal);
    return HELICS_TRUE;
}